

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

path * boost::filesystem::detail::relative
                 (path *__return_storage_ptr__,path *p,path *base,error_code *ec)

{
  error_code *this;
  bool bVar1;
  int iVar2;
  undefined1 local_88 [8];
  path wc_p;
  undefined1 local_58 [8];
  path wc_base;
  error_code tmp_ec;
  error_code *ec_local;
  path *base_local;
  path *p_local;
  
  this = (error_code *)((long)&wc_base.m_pathname.field_2 + 8);
  system::error_code::error_code(this);
  weakly_canonical((path *)local_58,base,this);
  iVar2 = system::error_code::value(this);
  bVar1 = anon_unknown.dwarf_522f::error(iVar2,base,ec,"boost::filesystem::relative");
  if (bVar1) {
    filesystem::path::path(__return_storage_ptr__);
    wc_p.m_pathname.field_2._8_4_ = 1;
  }
  else {
    weakly_canonical((path *)local_88,p,(error_code *)((long)&wc_base.m_pathname.field_2 + 8));
    iVar2 = system::error_code::value((error_code *)((long)&wc_base.m_pathname.field_2 + 8));
    bVar1 = anon_unknown.dwarf_522f::error(iVar2,base,ec,"boost::filesystem::relative");
    if (bVar1) {
      filesystem::path::path(__return_storage_ptr__);
    }
    else {
      filesystem::path::lexically_relative(__return_storage_ptr__,(path *)local_88,(path *)local_58)
      ;
    }
    wc_p.m_pathname.field_2._8_4_ = 1;
    filesystem::path::~path((path *)local_88);
  }
  filesystem::path::~path((path *)local_58);
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path relative(const path& p, const path& base, error_code* ec)
  {
    error_code tmp_ec;
    path wc_base(weakly_canonical(base, &tmp_ec));
    if (error(tmp_ec.value(), base, ec, "boost::filesystem::relative"))
      return path();
    path wc_p(weakly_canonical(p, &tmp_ec));
    if (error(tmp_ec.value(), base, ec, "boost::filesystem::relative"))
      return path();
    return wc_p.lexically_relative(wc_base);
  }